

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udatamem.cpp
# Opt level: O0

void udata_close_63(UDataMemory *pData)

{
  UDataMemory *pData_local;
  
  if (pData != (UDataMemory *)0x0) {
    uprv_unmapFile_63(pData);
    if (pData->heapAllocated == '\0') {
      UDataMemory_init_63(pData);
    }
    else {
      uprv_free_63(pData);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_close(UDataMemory *pData) {
    if(pData!=NULL) {
        uprv_unmapFile(pData);
        if(pData->heapAllocated ) {
            uprv_free(pData);
        } else {
            UDataMemory_init(pData);
        }
    }
}